

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O3

bool __thiscall
duckdb::Binder::BindTableFunctionParameters
          (Binder *this,TableFunctionCatalogEntry *table_function,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::Value,_true> *parameters,named_parameter_map_t *named_parameters,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery,ErrorData *error)

{
  ExpressionBinder *this_00;
  pointer puVar1;
  LogicalType *pLVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  long *plVar4;
  ClientContext *pCVar5;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var6;
  pointer pcVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [8];
  bool bVar17;
  int iVar18;
  pointer pPVar19;
  reference pvVar20;
  long lVar21;
  BaseExpression *pBVar22;
  ComparisonExpression *pCVar23;
  ColumnRefExpression *this_01;
  pointer pEVar24;
  type expr_00;
  mapped_type *this_02;
  Binder *pBVar25;
  SubqueryExpression *pSVar26;
  pointer pSVar27;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var28;
  pointer pBVar29;
  type other;
  undefined8 extraout_RAX;
  pointer pBVar30;
  ParameterNotResolvedException *this_03;
  BinderException *this_04;
  InternalException *pIVar31;
  pointer pLVar32;
  size_type __n;
  iterator __end1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  pointer this_05;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  string parameter_name;
  Value constant;
  LogicalType sql_type;
  TableFunctionBinder binder;
  key_type local_3b0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *local_390;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_388;
  string *local_380;
  string *local_378;
  ulong local_370;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  undefined1 local_338 [64];
  undefined1 local_2f8 [8];
  _Alloc_hider local_2f0;
  char local_2e8 [8];
  char local_2e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_2c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2b0 [56];
  Binder *local_278;
  __node_base local_270;
  FunctionSet<duckdb::TableFunction> *local_268;
  pointer local_260;
  string local_258;
  LogicalType local_238;
  LogicalType local_220;
  undefined1 local_208 [32];
  undefined1 local_1e8 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  _Alloc_hider local_180;
  LogicalType local_170 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_05 = (expressions->
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_390 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)parameters;
  local_368 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)named_parameters;
  while( true ) {
    if (this_05 == puVar1) goto LAB_0070eb54;
    pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(this_05);
    iVar18 = (*(pPVar19->super_BaseExpression)._vptr_BaseExpression[5])(pPVar19);
    if ((char)iVar18 == '\0') break;
    this_05 = this_05 + 1;
  }
  if ((table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
      super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
      super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
      super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
      super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
      super__Vector_impl_data._M_start) goto LAB_0070eb54;
  __n = 0;
  bVar17 = false;
  bVar10 = 0;
  bVar8 = false;
  do {
    pvVar20 = vector<duckdb::TableFunction,_true>::operator[]
                        (&(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                          functions,__n);
    for (pLVar32 = (pvVar20->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pLVar32 !=
        (pvVar20->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish; pLVar32 = pLVar32 + 1) {
      bVar17 = (bool)(bVar17 | pLVar32->id_ == TABLE);
    }
    bVar9 = true;
    if ((((pvVar20->in_out_function == (table_in_out_function_t)0x0) &&
         (bVar10 = 1, bVar9 = bVar8, pvVar20->function == (table_function_t)0x0)) &&
        (pvVar20->bind_replace == (table_function_bind_replace_t)0x0)) &&
       (pvVar20->bind_operator == (table_function_bind_operator_t)0x0)) {
      pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,
                 "Function \"%s\" has neither in_out_function nor function defined","");
      local_2f8 = (undefined1  [8])local_2e8;
      pcVar7 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
               super_CatalogEntry.name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f8,pcVar7,
                 pcVar7 + (table_function->super_FunctionEntry).super_StandardEntry.
                          super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar31,(string *)local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
      __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    __n = __n + 1;
    lVar21 = (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                   super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                   super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                   super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                   super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    bVar8 = bVar9;
  } while (__n < (ulong)((lVar21 >> 3) * 0x6fb586fb586fb587));
  if (bVar17) {
    bVar8 = true;
    if (lVar21 != 0x1b8) {
      pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,
                 "Function \"%s\" has a TABLE parameter, and multiple function overloads - this is not supported"
                 ,"");
      local_338._0_8_ = local_338 + 0x10;
      pcVar7 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
               super_CatalogEntry.name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_338,pcVar7,
                 pcVar7 + (table_function->super_FunctionEntry).super_StandardEntry.
                          super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar31,(string *)local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
      __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((bool)(bVar10 & bVar9)) {
      pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,
                 "Function \"%s\" is both an in_out_function and a table function","");
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      pcVar7 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
               super_CatalogEntry.name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar7,
                 pcVar7 + (table_function->super_FunctionEntry).super_StandardEntry.
                          super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar31,(string *)local_1e8,&local_3b0);
      __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar9) {
      BindTableInTableOutFunction(this,expressions,subquery);
      pBVar29 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                ::operator->(subquery);
      pBVar30 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar29->subquery);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)arguments,
                 &(pBVar30->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return true;
    }
LAB_0070eb54:
    bVar8 = false;
  }
  result_type.ptr =
       (LogicalType *)
       (expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (LogicalType *)
           (expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (result_type.ptr == pLVar2) {
    return true;
  }
  local_378 = (string *)&error->raw_message;
  local_380 = (string *)&error->final_message;
  local_388 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&error->extra_info;
  local_270._M_nxt = (_Hash_node_base *)&PTR__TableFunction_01963be0;
  local_278 = (Binder *)&PTR__BoundSubqueryRef_0197d2c0;
  local_260 = (pointer)&PTR__TableFunctionBinder_0197dab0;
  local_268 = &(table_function->functions).super_FunctionSet<duckdb::TableFunction>;
  this_00 = (ExpressionBinder *)(local_360 + 0x20);
  local_370 = 0;
  do {
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    local_3b0._M_string_length = 0;
    local_3b0.field_2._M_local_buf[0] = '\0';
    pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)result_type.ptr);
    if ((pPVar19->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
      pBVar22 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)result_type.ptr)->super_BaseExpression;
      pCVar23 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar22);
      pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&pCVar23->left);
      if ((pPVar19->super_BaseExpression).type == COLUMN_REF) {
        pBVar22 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pCVar23->left)->super_BaseExpression;
        this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar22);
        bVar17 = ColumnRefExpression::IsQualified(this_01);
        if (!bVar17) {
          ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
          ::std::__cxx11::string::_M_assign((string *)&local_3b0);
          _Var3._M_head_impl =
               (pCVar23->right).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pCVar23->right).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          plVar4 = *(long **)result_type.ptr;
          *(ParsedExpression **)result_type.ptr = _Var3._M_head_impl;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 8))();
          }
        }
      }
    }
    else {
      pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)result_type.ptr);
      if ((pPVar19->super_BaseExpression).alias._M_string_length != 0) {
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)result_type.ptr);
        ::std::__cxx11::string::_M_assign((string *)&local_3b0);
      }
    }
    if ((bVar8) &&
       (pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)result_type.ptr), (pPVar19->super_BaseExpression).type == SUBQUERY
       )) {
      FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
                ((TableFunction *)local_1e8,local_268,0);
      if (((long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                 super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                 super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 _M_impl.super__Vector_impl_data._M_start != 0x1b8) ||
         (local_1a0[0]._M_allocated_capacity == local_1a0[0]._8_8_)) {
        this_04 = (BinderException *)__cxa_allocate_exception(0x10);
        local_2f8 = (undefined1  [8])local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f8,
                   "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters"
                   ,"");
        local_208._0_8_ = local_208 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,local_1e8._8_8_,(pointer)(local_1e8._8_8_ + local_1e8._16_8_)
                  );
        BinderException::BinderException<std::__cxx11::string>
                  (this_04,(string *)local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
        __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((local_370 & 1) == 0) {
        CreateBinder((Binder *)local_338,this->context,(optional_ptr<duckdb::Binder,_true>)this,
                     REGULAR_BINDER);
        pBVar25 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_338);
        pBVar25->can_contain_nulls = true;
        pBVar22 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)result_type.ptr)->super_BaseExpression;
        pSVar26 = BaseExpression::Cast<duckdb::SubqueryExpression>(pBVar22);
        pBVar25 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_338);
        pSVar27 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  ::operator->(&pSVar26->subquery);
        unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                  (&pSVar27->node);
        BindNode((Binder *)local_360,(QueryNode *)pBVar25);
        _Var28._M_head_impl = (BoundSubqueryRef *)operator_new(0x30);
        uVar11 = local_360._0_8_;
        uVar12 = local_338._0_4_;
        uVar13 = local_338._4_4_;
        uVar14 = local_338._8_4_;
        uVar15 = local_338._12_4_;
        local_338._0_8_ = (_Hash_node_base *)0x0;
        local_338._8_8_ = (element_type *)0x0;
        local_360._0_8_ = (BoundQueryNode *)0x0;
        ((_Var28._M_head_impl)->super_BoundTableRef).type = SUBQUERY;
        ((_Var28._M_head_impl)->super_BoundTableRef).sample.
        super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
             (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
        *(Binder **)&(_Var28._M_head_impl)->super_BoundTableRef = local_278;
        *(undefined4 *)&((_Var28._M_head_impl)->binder).internal = uVar12;
        *(undefined4 *)
         ((long)&((_Var28._M_head_impl)->binder).internal.
                 super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar13
        ;
        *(undefined4 *)
         &((_Var28._M_head_impl)->binder).internal.
          super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar14;
        *(undefined4 *)
         ((long)&((_Var28._M_head_impl)->binder).internal.
                 super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
         4) = uVar15;
        ((_Var28._M_head_impl)->subquery).
        super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> =
             (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
             uVar11;
        _Var6._M_head_impl =
             (subquery->
             super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
             .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
        (subquery->
        super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
        .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl = _Var28._M_head_impl
        ;
        if (_Var6._M_head_impl != (BoundSubqueryRef *)0x0) {
          (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BoundTableRef + 8))();
        }
        pBVar29 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                  ::operator->(subquery);
        other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar29->binder);
        MoveCorrelatedExpressions(this,other);
        local_2f8[0] = true;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalTypeId>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)arguments,
                   local_2f8);
        LogicalType::LogicalType(&local_220,SQLNULL);
        Value::Value((Value *)local_2f8,&local_220);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  (local_390,(Value *)local_2f8);
        Value::~Value((Value *)local_2f8);
        LogicalType::~LogicalType(&local_220);
        if ((BoundQueryNode *)local_360._0_8_ != (BoundQueryNode *)0x0) {
          (**(code **)(*(long *)local_360._0_8_ + 8))();
        }
        if ((element_type *)local_338._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
        }
        iVar18 = 3;
      }
      else {
        local_338._0_8_ = local_338 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"Table function can have at most one subquery parameter","");
        ErrorData::ErrorData((ErrorData *)local_2f8,(string *)local_338);
        auVar16 = local_2f8;
        error->initialized = (bool)local_2f8[0];
        error->type = local_2f8[1];
        local_2f8 = auVar16;
        ::std::__cxx11::string::operator=(local_378,(string *)&local_2f0);
        ::std::__cxx11::string::operator=(local_380,(string *)local_2d0._M_local_buf);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign(local_388,local_2b0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_2b0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._M_allocated_capacity !=
            &local_2c0) {
          operator_delete((void *)local_2d0._M_allocated_capacity);
        }
        if (local_2f0._M_p != local_2e8 + 8) {
          operator_delete(local_2f0._M_p);
        }
        if ((_Hash_node_base *)local_338._0_8_ != (_Hash_node_base *)(local_338 + 0x10)) {
          operator_delete((void *)local_338._0_8_);
        }
        iVar18 = 1;
      }
      local_1e8._0_8_ = local_270._M_nxt;
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      }
      SimpleNamedParameterFunction::~SimpleNamedParameterFunction
                ((SimpleNamedParameterFunction *)local_1e8);
      local_370 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      pCVar5 = this->context;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      pcVar7 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
               super_CatalogEntry.name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,pcVar7,
                 pcVar7 + (table_function->super_FunctionEntry).super_StandardEntry.
                          super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
      TableFunctionBinder::TableFunctionBinder
                ((TableFunctionBinder *)local_1e8,this,pCVar5,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      LogicalType::LogicalType(&local_238);
      ExpressionBinder::Bind
                (this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)local_1e8,result_type,SUB81(&local_238,0));
      pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_00);
      iVar18 = (*(pEVar24->super_BaseExpression)._vptr_BaseExpression[6])(pEVar24);
      if ((char)iVar18 != '\0') {
        this_03 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_03);
        __cxa_throw(this_03,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_00);
      iVar18 = (*(pEVar24->super_BaseExpression)._vptr_BaseExpression[5])(pEVar24);
      if ((char)iVar18 == '\0') {
        pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
        local_2f8 = (undefined1  [8])local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f8,"Table function requires a constant parameter","");
        InternalException::InternalException(pIVar31,(string *)local_2f8);
        __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar5 = this->context;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this_00);
      ExpressionExecutor::EvaluateScalar((Value *)local_338,pCVar5,expr_00,true);
      if (local_3b0._M_string_length == 0) {
        if (*(long *)(local_368 + 0x18) == 0) {
          if (local_338[0x18] == '\x01') {
            LogicalType::LogicalType((LogicalType *)local_2f8,SQLNULL);
          }
          else {
            LogicalType::LogicalType((LogicalType *)local_2f8,&local_238);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
          emplace_back<duckdb::LogicalType>
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)arguments,
                     (LogicalType *)local_2f8);
          LogicalType::~LogicalType((LogicalType *)local_2f8);
          iVar18 = 0;
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (local_390,(Value *)local_338);
        }
        else {
          local_360._0_8_ = local_360 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"Unnamed parameters cannot come after named parameters","")
          ;
          ErrorData::ErrorData((ErrorData *)local_2f8,(string *)local_360);
          auVar16 = local_2f8;
          error->initialized = (bool)local_2f8[0];
          error->type = local_2f8[1];
          local_2f8 = auVar16;
          ::std::__cxx11::string::operator=(local_378,(string *)&local_2f0);
          ::std::__cxx11::string::operator=(local_380,(string *)local_2d0._M_local_buf);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(local_388,local_2b0);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(local_2b0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._M_allocated_capacity !=
              &local_2c0) {
            operator_delete((void *)local_2d0._M_allocated_capacity);
          }
          if (local_2f0._M_p != local_2e8 + 8) {
            operator_delete(local_2f0._M_p);
          }
          if ((BoundQueryNode *)local_360._0_8_ != (BoundQueryNode *)(local_360 + 0x10)) {
            operator_delete((void *)local_360._0_8_);
          }
          iVar18 = 1;
        }
      }
      else {
        this_02 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_368,&local_3b0);
        Value::operator=(this_02,(Value *)local_338);
        iVar18 = 0;
      }
      Value::~Value((Value *)local_338);
      if (local_340 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_340 + 8))();
      }
      LogicalType::~LogicalType(&local_238);
      local_1e8._0_8_ = local_260;
      if ((LogicalType *)local_180._M_p != local_170) {
        operator_delete(local_180._M_p);
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_1e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    if ((iVar18 != 3) && (iVar18 != 0)) {
      return false;
    }
    result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_;
    if (result_type.ptr == pLVar2) {
      return true;
    }
  } while( true );
}

Assistant:

bool Binder::BindTableFunctionParameters(TableFunctionCatalogEntry &table_function,
                                         vector<unique_ptr<ParsedExpression>> &expressions,
                                         vector<LogicalType> &arguments, vector<Value> &parameters,
                                         named_parameter_map_t &named_parameters,
                                         unique_ptr<BoundSubqueryRef> &subquery, ErrorData &error) {
	auto bind_type = GetTableFunctionBindType(table_function, expressions);
	if (bind_type == TableFunctionBindType::TABLE_IN_OUT_FUNCTION) {
		// bind table in-out function
		BindTableInTableOutFunction(expressions, subquery);
		// fetch the arguments from the subquery
		arguments = subquery->subquery->types;
		return true;
	}
	bool seen_subquery = false;
	for (auto &child : expressions) {
		string parameter_name;

		// hack to make named parameters work
		if (child->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
			// comparison, check if the LHS is a columnref
			auto &comp = child->Cast<ComparisonExpression>();
			if (comp.left->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = comp.left->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					parameter_name = colref.GetColumnName();
					child = std::move(comp.right);
				}
			}
		} else if (!child->GetAlias().empty()) {
			// <name> => <expression> will set the alias of <expression> to <name>
			parameter_name = child->GetAlias();
		}
		if (bind_type == TableFunctionBindType::TABLE_PARAMETER_FUNCTION &&
		    child->GetExpressionType() == ExpressionType::SUBQUERY) {
			D_ASSERT(table_function.functions.Size() == 1);
			auto fun = table_function.functions.GetFunctionByOffset(0);
			if (table_function.functions.Size() != 1 || fun.arguments.empty()) {
				throw BinderException(
				    "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters",
				    fun.name);
			}
			if (seen_subquery) {
				error = ErrorData("Table function can have at most one subquery parameter");
				return false;
			}
			auto binder = Binder::CreateBinder(this->context, this);
			binder->can_contain_nulls = true;
			auto &se = child->Cast<SubqueryExpression>();
			auto node = binder->BindNode(*se.subquery->node);
			subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
			MoveCorrelatedExpressions(*subquery->binder);
			seen_subquery = true;
			arguments.emplace_back(LogicalTypeId::TABLE);
			parameters.emplace_back(Value());
			continue;
		}

		TableFunctionBinder binder(*this, context, table_function.name);
		LogicalType sql_type;
		auto expr = binder.Bind(child, &sql_type);
		if (expr->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!expr->IsScalar()) {
			// should have been eliminated before
			throw InternalException("Table function requires a constant parameter");
		}
		auto constant = ExpressionExecutor::EvaluateScalar(context, *expr, true);
		if (parameter_name.empty()) {
			// unnamed parameter
			if (!named_parameters.empty()) {
				error = ErrorData("Unnamed parameters cannot come after named parameters");
				return false;
			}
			arguments.emplace_back(constant.IsNull() ? LogicalType::SQLNULL : sql_type);
			parameters.emplace_back(std::move(constant));
		} else {
			named_parameters[parameter_name] = std::move(constant);
		}
	}
	return true;
}